

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O3

time_exactness_t parse_time_exactness(char *value)

{
  byte bVar1;
  time_exactness_t tVar2;
  
  bVar1 = *value;
  tVar2 = (time_exactness_t)bVar1;
  if (bVar1 != 0) {
    if (bVar1 == 0x31) {
      return TE_NOT_SET - (value[1] == '\0');
    }
    if (bVar1 == 0x30) {
      return (uint)(value[1] != '\0') * 2;
    }
    tVar2 = TE_NOT_SET;
  }
  return tVar2;
}

Assistant:

time_exactness_t parse_time_exactness(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return TE_NOT_EXACT;
    else if (strcmp(value, "1") == 0)
        return TE_EXACT;
    else
        return TE_NOT_SET;
}